

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FileDescriptor *file;
  long lVar2;
  FieldGenerator *pFVar3;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  long lVar4;
  int i;
  long lVar5;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,"void $classname$::SharedDtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  lVar4 = 0;
  for (lVar5 = 0; pDVar1 = this->descriptor_, lVar5 < *(int *)(pDVar1 + 0x2c); lVar5 = lVar5 + 1) {
    pFVar3 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar4));
    (*pFVar3->_vptr_FieldGenerator[10])(pFVar3,printer);
    lVar4 = lVar4 + 0x78;
  }
  file = *(FileDescriptor **)(pDVar1 + 0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_72);
  PrintHandlingOptionalStaticInitializers
            (file,printer,"if (this != default_instance_) {\n",
             "if (this != &default_instance()) {\n",(char *)0x0,&local_70,(char *)0x0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  lVar4 = 0;
  field = extraout_RDX;
  for (lVar5 = 0; lVar5 < *(int *)(this->descriptor_ + 0x2c); lVar5 = lVar5 + 1) {
    lVar2 = *(long *)(this->descriptor_ + 0x30);
    if ((*(int *)(lVar2 + 0x30 + lVar4) != 3) &&
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar2 + 0x2c + lVar4) * 4) ==
        10)) {
      FieldName_abi_cxx11_(&local_70,(cpp *)(lVar2 + lVar4),field);
      io::Printer::Print(printer,"  delete $name$_;\n","name",&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      field = extraout_RDX_00;
    }
    lVar4 = lVar4 + 0x78;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedDestructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedDtor() {\n",
    "classname", classname_);
  printer->Indent();
  // Write the destructors for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateDestructorCode(printer);
  }

  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "if (this != default_instance_) {\n",
    // Without.
    "if (this != &default_instance()) {\n");

  // We need to delete all embedded messages.
  // TODO(kenton):  If we make unset messages point at default instances
  //   instead of NULL, then it would make sense to move this code into
  //   MessageFieldGenerator::GenerateDestructorCode().
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print("  delete $name$_;\n",
                     "name", FieldName(field));
    }
  }

  printer->Outdent();
  printer->Print(
    "  }\n"
    "}\n"
    "\n");
}